

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::Psbt::GetTxInCount(Psbt *this)

{
  long lVar1;
  CfdException *pCVar2;
  allocator local_39;
  undefined1 local_38 [32];
  
  if (this->wally_psbt_pointer_ == (void *)0x0) {
    local_38._0_8_ = "cfdcore_psbt.cpp";
    local_38._8_4_ = 0x871;
    local_38._16_8_ = "GetTxInCount";
    logger::warn<>((CfdSourceLocation *)local_38,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_38,"psbt pointer is null.",&local_39);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_38);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  lVar1 = *(long *)((long)this->wally_psbt_pointer_ + 8);
  if (lVar1 != 0) {
    return *(uint32_t *)(lVar1 + 0x10);
  }
  local_38._0_8_ = "cfdcore_psbt.cpp";
  local_38._8_4_ = 0x874;
  local_38._16_8_ = "GetTxInCount";
  logger::warn<>((CfdSourceLocation *)local_38,"psbt base tx is null");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"psbt base tx is null.",&local_39);
  CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_38);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Psbt::GetTxInCount() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(kCfdIllegalStateError, "psbt base tx is null.");
  }
  return static_cast<uint32_t>(psbt_pointer->tx->num_inputs);
}